

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

void checkAttributes(int line,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *attributes,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *required,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *optional)

{
  _Rb_tree_node_base *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_108;
  int local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Rb_tree_node_base *local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_38;
  
  p_Var6 = (required->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(required->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_e4 = line;
  local_a0 = (_Rb_tree_node_base *)attributes;
  local_50 = &optional->_M_t;
  local_38 = &required->_M_t;
  if (p_Var6 != local_48) {
    local_40 = &(attributes->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_a0,p_Var6 + 1);
      std::operator+(&local_e0,"missing attribute <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1));
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_e0,">");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar4->_M_dataplus)._M_p;
      paVar9 = &pbVar4->field_2;
      if (paVar1 == paVar9) {
        local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      }
      else {
        local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      local_108._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      checkForError(cVar3._M_node != local_40,local_e4,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (p_Var6[3]._M_parent != (_Base_ptr)0x0) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,",","");
        tokenize(&local_68,(string *)(cVar3._M_node + 2),&local_108);
        local_98 = p_Var6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        pbVar2 = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          p_Var6 = local_98 + 2;
          local_90 = (_Base_ptr)&local_98[2]._M_parent;
          pbVar10 = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(p_Var6,pbVar10);
            std::operator+(&local_88,"unexpected attribute value <",pbVar10);
            pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_88,"> in attribute <");
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar4->_M_dataplus)._M_p;
            paVar9 = &pbVar4->field_2;
            if (paVar1 == paVar9) {
              local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            }
            else {
              local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_c0._M_dataplus._M_p = (pointer)paVar1;
            }
            local_c0._M_string_length = pbVar4->_M_string_length;
            (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar4->_M_string_length = 0;
            (pbVar4->field_2)._M_local_buf[0] = '\0';
            pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_c0,*(char **)(cVar3._M_node + 1),
                                 (size_type)cVar3._M_node[1]._M_parent);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar4->_M_dataplus)._M_p;
            paVar9 = &pbVar4->field_2;
            if (paVar1 == paVar9) {
              local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            }
            else {
              local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_e0._M_dataplus._M_p = (pointer)paVar1;
            }
            local_e0._M_string_length = pbVar4->_M_string_length;
            (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar4->_M_string_length = 0;
            (pbVar4->field_2)._M_local_buf[0] = '\0';
            pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_e0,">");
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar4->_M_dataplus)._M_p;
            paVar9 = &pbVar4->field_2;
            if (paVar1 == paVar9) {
              local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            }
            else {
              local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_108._M_dataplus._M_p = (pointer)paVar1;
            }
            local_108._M_string_length = pbVar4->_M_string_length;
            (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar4->_M_string_length = 0;
            (pbVar4->field_2)._M_local_buf[0] = '\0';
            checkForError(cVar5._M_node != local_90,local_e4,&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != pbVar2);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        p_Var6 = local_98;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_48);
  }
  p_Var8 = (((_Rep_type *)&local_a0->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_a0 = &(((_Rep_type *)&local_a0->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var8 != local_a0) {
    local_98 = &(((_Rep_type *)&local_50->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
    do {
      __k = p_Var8 + 1;
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::find(local_38,(key_type *)__k);
      if (cVar7._M_node == local_48) {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::find(local_50,(key_type *)__k);
        if (cVar7._M_node == local_98) {
          std::operator+(&local_e0,"unknown attribute <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_e0,">");
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar9 = &pbVar4->field_2;
          if (paVar1 == paVar9) {
            local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_108._M_dataplus._M_p = (pointer)paVar1;
          }
          local_108._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          checkForWarning(false,local_e4,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
        else if (cVar7._M_node[3]._M_parent != (_Base_ptr)0x0) {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,",","");
          tokenize(&local_68,(string *)(p_Var8 + 2),&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          pbVar2 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_90 = cVar7._M_node + 2;
            pbVar10 = local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              cVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(local_90,pbVar10);
              std::operator+(&local_88,"unexpected attribute value <",pbVar10);
              pbVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_88,"> in attribute <");
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar4->_M_dataplus)._M_p;
              paVar9 = &pbVar4->field_2;
              if (paVar1 == paVar9) {
                local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
              }
              else {
                local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_c0._M_dataplus._M_p = (pointer)paVar1;
              }
              local_c0._M_string_length = pbVar4->_M_string_length;
              (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar4->_M_string_length = 0;
              (pbVar4->field_2)._M_local_buf[0] = '\0';
              pbVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_c0,*(char **)(p_Var8 + 1),(size_type)p_Var8[1]._M_parent);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar4->_M_dataplus)._M_p;
              paVar9 = &pbVar4->field_2;
              if (paVar1 == paVar9) {
                local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
              }
              else {
                local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_e0._M_dataplus._M_p = (pointer)paVar1;
              }
              local_e0._M_string_length = pbVar4->_M_string_length;
              (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar4->_M_string_length = 0;
              (pbVar4->field_2)._M_local_buf[0] = '\0';
              pbVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_e0,">");
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar4->_M_dataplus)._M_p;
              paVar9 = &pbVar4->field_2;
              if (paVar1 == paVar9) {
                local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
              }
              else {
                local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_108._M_dataplus._M_p = (pointer)paVar1;
              }
              local_108._M_string_length = pbVar4->_M_string_length;
              (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar4->_M_string_length = 0;
              (pbVar4->field_2)._M_local_buf[0] = '\0';
              checkForWarning(cVar5._M_node != (_Base_ptr)&cVar7._M_node[2]._M_parent,local_e4,
                              &local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              pbVar10 = pbVar10 + 1;
            } while (pbVar10 != pbVar2);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
        }
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_a0);
  }
  return;
}

Assistant:

inline void checkAttributes( int                                                  line,
                             std::map<std::string, std::string> const &           attributes,
                             std::map<std::string, std::set<std::string>> const & required,
                             std::map<std::string, std::set<std::string>> const & optional )
{
  // check if all required attributes are included and if there is a set of allowed values, check if the actual
  // value is part of that set
  for ( auto const & r : required )
  {
    auto attributesIt = attributes.find( r.first );
    checkForError( attributesIt != attributes.end(), line, "missing attribute <" + r.first + ">" );
    if ( !r.second.empty() )
    {
      std::vector<std::string> values = tokenize( attributesIt->second, "," );
      for ( auto const & v : values )
      {
        checkForError( r.second.find( v ) != r.second.end(), line, "unexpected attribute value <" + v + "> in attribute <" + attributesIt->first + ">" );
      }
    }
  }
  // check if all not required attributes or optional, and if there is a set of allowed values, check if the
  // actual value is part of that set
  for ( auto const & a : attributes )
  {
    if ( required.find( a.first ) == required.end() )
    {
      auto optionalIt = optional.find( a.first );
      if ( optionalIt == optional.end() )
      {
        checkForWarning( false, line, "unknown attribute <" + a.first + ">" );
        continue;
      }
      else if ( !optionalIt->second.empty() )
      {
        std::vector<std::string> values = tokenize( a.second, "," );
        for ( auto const & v : values )
        {
          checkForWarning(
            optionalIt->second.find( v ) != optionalIt->second.end(), line, "unexpected attribute value <" + v + "> in attribute <" + a.first + ">" );
        }
      }
    }
  }
}